

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertEqualStringArray
               (void *expected,char **actual,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_FLAGS_T flags)

{
  char *actual_00;
  int iVar1;
  bool bVar2;
  char *act;
  char *expd;
  uint local_38;
  UNITY_UINT32 j;
  UNITY_UINT32 i;
  UNITY_FLAGS_T flags_local;
  UNITY_UINT lineNumber_local;
  char *msg_local;
  UNITY_UINT32 num_elements_local;
  char **actual_local;
  void *expected_local;
  
  expd._4_4_ = 0;
  act = (char *)0x0;
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    if (num_elements == 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    if ((char **)expected != actual) {
      iVar1 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      if (iVar1 != 0) {
        Unity.CurrentTestFailed = 1;
        longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
      }
      if (flags != UNITY_ARRAY_TO_ARRAY) {
        act = (char *)expected;
      }
      do {
        actual_00 = actual[expd._4_4_];
        if (flags == UNITY_ARRAY_TO_ARRAY) {
          act = *(char **)((long)expected + (ulong)expd._4_4_ * 8);
        }
        if ((act == (char *)0x0) || (actual_00 == (char *)0x0)) {
          if (act != actual_00) {
            Unity.CurrentTestFailed = 1;
          }
        }
        else {
          local_38 = 0;
          while( true ) {
            bVar2 = true;
            if (act[local_38] == '\0') {
              bVar2 = actual_00[local_38] != '\0';
            }
            if (!bVar2) goto LAB_0010b12b;
            if (act[local_38] != actual_00[local_38]) break;
            local_38 = local_38 + 1;
          }
          Unity.CurrentTestFailed = 1;
        }
LAB_0010b12b:
        if (Unity.CurrentTestFailed != 0) {
          UnityTestResultsFailBegin(lineNumber);
          if (1 < num_elements) {
            UnityPrint(" Element ");
            UnityPrintNumberUnsigned((ulong)expd._4_4_);
          }
          UnityPrintExpectedAndActualStrings(act,actual_00);
          UnityAddMsgIfSpecified(msg);
          Unity.CurrentTestFailed = 1;
          longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
        }
        expd._4_4_ = expd._4_4_ + 1;
      } while (expd._4_4_ < num_elements);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualStringArray(UNITY_INTERNAL_PTR expected,
                                 const char** actual,
                                 const UNITY_UINT32 num_elements,
                                 const char* msg,
                                 const UNITY_LINE_TYPE lineNumber,
                                 const UNITY_FLAGS_T flags)
{
    UNITY_UINT32 i = 0;
    UNITY_UINT32 j = 0;
    const char* expd = NULL;
    const char* act = NULL;

    RETURN_IF_FAIL_OR_IGNORE;

    /* if no elements, it's an error */
    if (num_elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if ((const void*)expected == (const void*)actual)
    {
        return; /* Both are NULL or same pointer */
    }

    if (UnityIsOneArrayNull((UNITY_INTERNAL_PTR)expected, (UNITY_INTERNAL_PTR)actual, lineNumber, msg))
    {
        UNITY_FAIL_AND_BAIL;
    }

    if (flags != UNITY_ARRAY_TO_ARRAY)
    {
        expd = (const char*)expected;
    }

    do
    {
        act = actual[j];
        if (flags == UNITY_ARRAY_TO_ARRAY)
        {
            expd = ((const char* const*)expected)[j];
        }

        /* if both pointers not null compare the strings */
        if (expd && act)
        {
            for (i = 0; expd[i] || act[i]; i++)
            {
                if (expd[i] != act[i])
                {
                    Unity.CurrentTestFailed = 1;
                    break;
                }
            }
        }
        else
        { /* handle case of one pointers being null (if both null, test should pass) */
            if (expd != act)
            {
                Unity.CurrentTestFailed = 1;
            }
        }

        if (Unity.CurrentTestFailed)
        {
            UnityTestResultsFailBegin(lineNumber);
            if (num_elements > 1)
            {
                UnityPrint(UnityStrElement);
                UnityPrintNumberUnsigned(j);
            }
            UnityPrintExpectedAndActualStrings(expd, act);
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
    } while (++j < num_elements);
}